

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knucleotide.cc
# Opt level: O2

void WriteFrequencies<2u>(Data *input)

{
  ostream *poVar1;
  _Base_ptr p_Var2;
  uint uVar3;
  double dVar4;
  iterator __begin0;
  map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::greater<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  freq;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<Key<2UL>,_unsigned_int>,_Key<2UL>::Hash,_phmap::EqualTo<Key<2UL>_>,_std::allocator<std::pair<const_Key<2UL>,_unsigned_int>_>_>
  local_88;
  undefined1 local_58 [40];
  
  CalculateInThreads<2ul>((HashTable<1UL> *)&local_88,input);
  freq._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &freq._M_t._M_impl.super__Rb_tree_header._M_header;
  freq._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  freq._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  freq._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  freq._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       freq._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  __begin0 = phmap::priv::
             raw_hash_set<phmap::priv::FlatHashMapPolicy<Key<2UL>,_unsigned_int>,_Key<2UL>::Hash,_phmap::EqualTo<Key<2UL>_>,_std::allocator<std::pair<const_Key<2UL>,_unsigned_int>_>_>
             ::begin(&local_88);
  while (__begin0.ctrl_ != local_88.ctrl_ + local_88.capacity_) {
    std::
    pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_Key<2UL>_&,_true>
              ((pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_58,(uint *)((long)__begin0.field_1.slot_ + 4),
               (Key<2UL> *)__begin0.field_1.slot_);
    std::
    _Rb_tree<unsigned_int,std::pair<unsigned_int_const,std::__cxx11::string>,std::_Select1st<std::pair<unsigned_int_const,std::__cxx11::string>>,std::greater<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::__cxx11::string>>>
    ::_M_insert_unique<std::pair<unsigned_int_const,std::__cxx11::string>>
              ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,std::__cxx11::string>,std::_Select1st<std::pair<unsigned_int_const,std::__cxx11::string>>,std::greater<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::__cxx11::string>>>
                *)&freq,(pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)local_58);
    std::__cxx11::string::~string((string *)(local_58 + 8));
    phmap::priv::
    raw_hash_set<phmap::priv::FlatHashMapPolicy<Key<2UL>,_unsigned_int>,_Key<2UL>::Hash,_phmap::EqualTo<Key<2UL>_>,_std::allocator<std::pair<const_Key<2UL>,_unsigned_int>_>_>
    ::iterator::operator++(&__begin0);
  }
  uVar3 = ~*(uint *)&(input->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl.super__Vector_impl_data._M_start +
          *(int *)&(input->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
  for (p_Var2 = freq._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &freq._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    poVar1 = std::operator<<((ostream *)&std::cout,(string *)&p_Var2[1]._M_parent);
    std::operator<<(poVar1,' ');
    if (uVar3 == 0) {
      dVar4 = 0.0;
    }
    else {
      dVar4 = (double)(p_Var2[1]._M_color * 100) / (double)uVar3;
    }
    poVar1 = std::ostream::_M_insert<double>(dVar4);
    std::operator<<(poVar1,'\n');
  }
  std::operator<<((ostream *)&std::cout,'\n');
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::greater<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&freq._M_t);
  phmap::priv::
  raw_hash_set<phmap::priv::FlatHashMapPolicy<Key<2UL>,_unsigned_int>,_Key<2UL>::Hash,_phmap::EqualTo<Key<2UL>_>,_std::allocator<std::pair<const_Key<2UL>,_unsigned_int>_>_>
  ::~raw_hash_set(&local_88);
  return;
}

Assistant:

void WriteFrequencies(const Cfg::Data& input)
{
    // we "receive" the returned object by move instead of copy.
    auto&& frequencies = CalculateInThreads<size>(input);
    std::map<unsigned, std::string, std::greater<unsigned>> freq;
    for(const auto& i: frequencies)
        freq.insert({i.second, i.first});

    const unsigned sum = static_cast<unsigned>(input.size()) + 1 - size;
    for(const auto& i : freq)
        std::cout << i.second << ' ' << (sum ? double(100 * i.first) / sum : 0.0) << '\n';
    std::cout << '\n';
}